

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void xPredIntraAngAdi_XY_19(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int xoffsets [64];
  uint auStack_238 [64];
  uint auStack_138 [66];
  
  uVar4 = iWidth * 0x5d >> 7;
  uVar2 = (ulong)(uint)iWidth;
  if (0 < iWidth) {
    uVar3 = 0x5d;
    uVar6 = 0;
    do {
      auStack_138[uVar6] = uVar3 >> 2 & 0x1f;
      auStack_238[uVar6] = uVar3 >> 7;
      uVar6 = uVar6 + 1;
      uVar3 = uVar3 + 0x5d;
    } while (uVar2 != uVar6);
  }
  if (iHeight <= (int)uVar4) {
    uVar4 = iHeight;
  }
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  else {
    uVar8 = 0xb;
    uVar6 = 0;
    do {
      uVar1 = uVar6 + 1;
      uVar3 = (int)((double)((int)uVar1 << 7) / 93.0 + 0.9999) - 1;
      if (iWidth <= (int)uVar3) {
        uVar3 = iWidth;
      }
      uVar5 = 0;
      if (0 < (int)uVar3) {
        uVar9 = 0;
        do {
          lVar7 = (long)(int)auStack_238[uVar9];
          uVar5 = auStack_138[uVar9];
          dst[uVar9] = (pel)(pSrc[lVar7 + (1 - uVar6)] * uVar5 +
                             (uVar5 + 0x20) * (uint)pSrc[lVar7 - uVar6] +
                             (0x40 - uVar5) * (uint)pSrc[lVar7 + (-1 - uVar6)] +
                             (0x20 - uVar5) * (uint)pSrc[lVar7 + (-2 - uVar6)] + 0x40 >> 7);
          uVar9 = uVar9 + 1;
          uVar5 = uVar3;
        } while (uVar3 != uVar9);
      }
      if ((int)uVar5 < iWidth) {
        uVar6 = uVar8 >> 3;
        uVar3 = (int)uVar8 * 4 & 0x1c;
        uVar9 = (ulong)uVar5;
        do {
          dst[uVar9] = (pel)((uint)pSrc[uVar9 - uVar6] * (uVar3 + 0x20) +
                             (uint)pSrc[uVar9 + (1 - uVar6)] * (0x40 - uVar3) +
                             (uint)pSrc[uVar9 + (2 - uVar6)] * (0x20 - uVar3) +
                             pSrc[uVar9 + (-1 - uVar6)] * uVar3 + 0x40 >> 7);
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
      dst = dst + i_dst;
      uVar8 = uVar8 + 0xb;
      uVar6 = uVar1;
    } while (uVar1 != uVar4);
  }
  if ((int)uVar4 < iHeight) {
    uVar6 = (ulong)uVar4;
    do {
      if (0 < iWidth) {
        uVar8 = 0;
        do {
          lVar7 = (long)(int)auStack_238[uVar8];
          uVar4 = auStack_138[uVar8];
          dst[uVar8] = (pel)(pSrc[lVar7 + (1 - uVar6)] * uVar4 +
                             (uVar4 + 0x20) * (uint)pSrc[lVar7 - uVar6] +
                             (0x40 - uVar4) * (uint)pSrc[lVar7 + (-1 - uVar6)] +
                             (0x20 - uVar4) * (uint)pSrc[lVar7 + (-2 - uVar6)] + 0x40 >> 7);
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      dst = dst + i_dst;
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)iHeight);
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_19(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    int i, j;
    pel *rpSrc = pSrc;
    pel *dst_base = dst - 8 * i_dst - 11;
    int xoffsets[64];
    int xsteps[64];
    int iTempD = 93;
    int step2_height = ((93 * iWidth) >> 7);

    for (i = 0; i < iWidth; i++, iTempD += 93) {
        xoffsets[i] = (iTempD >> 2) & 0x1f;
        xsteps[i] = iTempD >> 7;
    }

    iTempD = 11;

    step2_height = min(step2_height, iHeight);

    for (j = 0; j < step2_height; j++, iTempD += 11) {
        int step1_width = (int)(((j + 1) << 7) / 93.0 + 0.9999) - 1;
        int offsetx = (iTempD << 2) & 0x1f;
        pel *px = pSrc - (iTempD >> 3);
        int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;

        step1_width = min(step1_width, iWidth);

        for (i = 0; i < step1_width; i++) {
            pel *py = rpSrc - j + xsteps[i];
            int offsety = xoffsets[i];
            dst[i] = (py[-2] * (32 - offsety) + py[-1] * (64 - offsety) + py[0] * (32 + offsety) + py[1] * offsety + 64) >> 7;
        }
        px += i;

        for (; i < iWidth; i++, px++) {
            dst[i] = (px[2] * a + px[1] * b + px[0] * c + px[-1] * offsetx + 64) >> 7;
        }
        dst_base += i_dst;
        dst += i_dst;
    }

    for (; j < iHeight; j++) {
        for (i = 0; i < iWidth; i++) {
            pel *py = rpSrc - j + xsteps[i];
            int offsety = xoffsets[i];
            dst[i] = (py[-2] * (32 - offsety) + py[-1] * (64 - offsety) + py[0] * (32 + offsety) + py[1] * offsety + 64) >> 7;
        }
        dst_base += i_dst;
        dst += i_dst;
    }
}